

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O3

bool wipe_doMelt(int ticks)

{
  int iVar1;
  BYTE *pBVar2;
  int iVar3;
  short *psVar4;
  short *psVar5;
  int *piVar6;
  DFrameBuffer *pDVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  short *psVar11;
  int iVar12;
  short *psVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  short *psVar18;
  long lVar19;
  short *psVar20;
  
  piVar6 = y;
  psVar5 = wipe_scr_end;
  psVar4 = wipe_scr_start;
  if (ticks == 0) {
    bVar8 = true;
  }
  else {
    do {
      pDVar7 = screen;
      ticks = ticks + -1;
      bVar8 = true;
      lVar14 = 0;
      do {
        uVar10 = piVar6[lVar14];
        if ((int)uVar10 < 0) {
          uVar10 = uVar10 + 1;
LAB_003866b0:
          piVar6[lVar14] = uVar10;
          bVar8 = false;
        }
        else if (uVar10 < 200) {
          iVar9 = uVar10 + 1;
          if (0xf < uVar10) {
            iVar9 = 8;
          }
          uVar10 = iVar9 + uVar10;
          if (199 < uVar10) {
            uVar10 = 200;
          }
          goto LAB_003866b0;
        }
        if ((ticks == 0) && (-1 < (int)uVar10)) {
          iVar12 = (pDVar7->super_DSimpleCanvas).super_DCanvas.Width / 2;
          iVar9 = (iVar12 * (int)lVar14) / 0xa0;
          iVar12 = (((int)lVar14 + 1) * iVar12) / 0xa0;
          if (iVar9 < iVar12) {
            iVar1 = (pDVar7->super_DSimpleCanvas).super_DCanvas.Height;
            lVar15 = (long)iVar1;
            iVar3 = (int)(uVar10 * iVar1) / 200;
            iVar16 = (pDVar7->super_DSimpleCanvas).super_DCanvas.Pitch / 2;
            pBVar2 = (pDVar7->super_DSimpleCanvas).super_DCanvas.Buffer;
            lVar17 = (long)iVar9;
            psVar11 = (short *)(pBVar2 + lVar17 * 2);
            lVar19 = lVar15 * 2 * lVar17;
            psVar18 = (short *)((long)psVar5 + lVar19);
            psVar20 = (short *)(lVar19 + (long)psVar4);
            do {
              if (uVar10 * iVar1 + 199 < 399) {
                psVar13 = (short *)(pBVar2 + lVar17 * 2);
              }
              else {
                lVar19 = 0;
                psVar13 = psVar11;
                do {
                  *psVar13 = psVar18[lVar19];
                  psVar13 = psVar13 + iVar16;
                  lVar19 = lVar19 + 1;
                } while (iVar3 != (int)lVar19);
              }
              if (iVar1 != iVar3) {
                lVar19 = 0;
                do {
                  *psVar13 = psVar20[lVar19];
                  psVar13 = psVar13 + iVar16;
                  lVar19 = lVar19 + 1;
                } while (iVar1 - iVar3 != (int)lVar19);
              }
              lVar17 = lVar17 + 1;
              psVar11 = psVar11 + 1;
              psVar18 = psVar18 + lVar15;
              psVar20 = psVar20 + lVar15;
            } while (lVar17 != iVar12);
          }
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0xa0);
    } while (ticks != 0);
  }
  return bVar8;
}

Assistant:

bool wipe_doMelt (int ticks)
{
	int i, j, dy, x;
	const short *s;
	short *d;
	bool done = true;

	while (ticks--)
	{
		done = true;
		for (i = 0; i < MELT_WIDTH; i++)
		{
			if (y[i] < 0)
			{
				y[i]++;
				done = false;
			} 
			else if (y[i] < MELT_HEIGHT)
			{
				dy = (y[i] < 16) ? y[i]+1 : 8;
				y[i] = MIN(y[i] + dy, MELT_HEIGHT);
				done = false;
			}
			if (ticks == 0 && y[i] >= 0)
			{ // Only draw for the final tick.
				const int pitch = screen->GetPitch() / 2;
				int sy = y[i] * SCREENHEIGHT / MELT_HEIGHT;

				for (x = i * (SCREENWIDTH/2) / MELT_WIDTH; x < (i + 1) * (SCREENWIDTH/2) / MELT_WIDTH; ++x)
				{
					s = &wipe_scr_end[x*SCREENHEIGHT];
					d = &((short *)screen->GetBuffer())[x];

					for (j = sy; j != 0; --j)
					{
						*d = *(s++);
						d += pitch;
					}

					s = &wipe_scr_start[x*SCREENHEIGHT];

					for (j = SCREENHEIGHT - sy; j != 0; --j)
					{
						*d = *(s++);
						d += pitch;
					}
				}
			}
		}
	}

	return done;
}